

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

void __thiscall
tchecker::clock_reset_t::clock_reset_t
          (clock_reset_t *this,clock_id_t left_id,clock_id_t right_id,integer_t value)

{
  invalid_argument *piVar1;
  integer_t value_local;
  clock_id_t right_id_local;
  clock_id_t left_id_local;
  clock_reset_t *this_local;
  
  this->_left_id = left_id;
  this->_right_id = right_id;
  this->_value = value;
  if (this->_left_id == 0x7fffffff) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"reference clock is not a left-value clock");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->_value < 0) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"reset value should be >= 0");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

clock_reset_t::clock_reset_t(tchecker::clock_id_t left_id, tchecker::clock_id_t right_id, tchecker::integer_t value)
    : _left_id(left_id), _right_id(right_id), _value(value)
{
  if (_left_id == tchecker::REFCLOCK_ID)
    throw std::invalid_argument("reference clock is not a left-value clock");

  if (_value < 0)
    throw std::invalid_argument("reset value should be >= 0");
}